

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daemon.cpp
# Opt level: O2

void __thiscall Daemon::die_with_worker_status(Daemon *this,int status)

{
  ContextManager *pCVar1;
  char *pcVar2;
  uint __sig;
  string sStack_38;
  
  pCVar1 = ContextManager::get();
  __sig = status & 0x7f;
  if (__sig == 0) {
    format_abi_cxx11_(&sStack_38,"Worker exited with exitcode %d",(ulong)((uint)status >> 8) & 0xff)
    ;
    (**pCVar1->_vptr_ContextManager)(pCVar1,&sStack_38);
  }
  else {
    pcVar2 = strsignal(__sig);
    format_abi_cxx11_(&sStack_38,"Worker was killed with signal %d (%s)",(ulong)__sig,pcVar2);
    (**pCVar1->_vptr_ContextManager)(pCVar1,&sStack_38);
  }
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void Daemon::die_with_worker_status(int status) {
    if (WIFEXITED(status)) {
        die(format("Worker exited with exitcode %d", WEXITSTATUS(status)));
    } else {
        die(format("Worker was killed with signal %d (%s)", WTERMSIG(status), strsignal(WTERMSIG(status))));
    }
}